

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O1

int Potassco::xconvert<Clasp::OptParams::UscOption>
              (char *x,Set<Clasp::OptParams::UscOption> *out,char **errPos,int e)

{
  uint uVar1;
  int iVar2;
  KV *pKVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  uint n;
  char *next;
  Set<Clasp::OptParams::UscOption> local_5c;
  char *local_58;
  Set<Clasp::OptParams::UscOption> *local_50;
  char **local_48;
  Span<Potassco::KV> local_40;
  
  uVar5 = 0;
  iVar2 = xconvert(x,&local_5c.val,&local_58,0);
  if (iVar2 == 0) {
    local_58 = "";
    local_5c.val = 0;
    local_50 = out;
    local_48 = errPos;
    while( true ) {
      local_40.first = (KV *)&Clasp::enumMap(Clasp::OptParams::UscOption_const*)::map;
      local_40.size = 3;
      pKVar3 = findValue(&local_40,x + (*local_58 == ','),&local_58,",");
      errPos = local_48;
      out = local_50;
      if (pKVar3 == (KV *)0x0) break;
      local_5c.val = local_5c.val | pKVar3->value;
      uVar5 = uVar5 + 1;
      x = local_58;
    }
  }
  else {
    lVar4 = 0;
    uVar5 = 0;
    do {
      uVar1 = *(uint *)((long)&DAT_001e86a8 + lVar4);
      uVar5 = uVar1 | uVar5;
      bVar6 = (local_5c.val & ~uVar5) == 0;
      if (lVar4 == 0x20) break;
      lVar4 = lVar4 + 0x10;
    } while ((!bVar6 || local_5c.val == 0) && local_5c.val != uVar1);
    uVar5 = (uint)(bVar6 && local_5c.val != 0 || local_5c.val == uVar1);
  }
  if (uVar5 != 0) {
    out->val = local_5c.val;
    x = local_58;
  }
  if (errPos != (char **)0x0) {
    *errPos = x;
  }
  return uVar5;
}

Assistant:

static int xconvert(const char* x, Set<ET>& out, const char** errPos, int e) {
	const char* it = x, *next;
	unsigned n, len = 0u; ET v;
	if (xconvert(it, n, &next, e)) {
		const Potassco::Span<Potassco::KV> em = enumMap(static_cast<ET*>(0));
		for (size_t i = 0, sum = 0; i != em.size && !len; ++i) {
			sum |= static_cast<unsigned>(em[i].value);
			len += (n == static_cast<unsigned>(em[i].value)) || (n && (n & sum) == n);
		}
	}
	else {
		for (next = "", n = 0u; xconvert(it + int(*next == ','), v, &next, e); it = next, ++len) {
			n |= static_cast<unsigned>(v);
		}
	}
	if (len)    { out.val = n; it = next; }
	if (errPos) { *errPos = it; }
	return static_cast<int>(len);
}